

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gga_c_tca.c
# Opt level: O0

void func_fxc_unpol(xc_func_type *p,size_t ip,double *rho,double *sigma,double *lapl,double *tau,
                   xc_mgga_out_params *out)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double *pdVar8;
  double *in_RCX;
  long lVar9;
  double *in_RDX;
  long in_RSI;
  long *in_RDI;
  double *in_R9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  double dVar48;
  double dVar49;
  double dVar50;
  double dVar51;
  double dVar52;
  double dVar53;
  double dVar54;
  double dVar55;
  double dVar56;
  double dVar57;
  double dVar58;
  double dVar59;
  double dVar60;
  double dVar61;
  double dVar62;
  double dVar63;
  double dVar64;
  double dVar65;
  double dVar66;
  double __x;
  double dVar67;
  double dVar68;
  double dVar69;
  double dVar70;
  double dVar71;
  double __x_00;
  double dVar72;
  double dVar73;
  double dVar74;
  double dVar75;
  double dVar76;
  double dVar77;
  double dVar78;
  double dVar79;
  double dVar80;
  double dVar81;
  double dVar82;
  double dVar83;
  double dVar84;
  double dVar85;
  double dVar86;
  double dVar87;
  double dVar88;
  double dVar89;
  double dVar90;
  double dVar91;
  double dVar92;
  double dVar93;
  double dVar94;
  double dVar95;
  double dVar96;
  double dVar97;
  double dVar98;
  double dVar99;
  double dVar100;
  double dVar101;
  double dVar102;
  double dVar103;
  double dVar104;
  double dVar105;
  double __x_01;
  double dVar106;
  double dVar107;
  double dVar108;
  double dVar109;
  double __x_02;
  double dVar110;
  double dVar111;
  double dVar112;
  double dVar113;
  double dVar114;
  double dVar115;
  double dVar116;
  double dVar117;
  double dVar118;
  double dVar119;
  double dVar120;
  double dVar121;
  double dVar122;
  double dVar123;
  double dVar124;
  double dVar125;
  double dVar126;
  double dVar127;
  double dVar128;
  double dVar129;
  double dVar130;
  double dVar131;
  double dVar132;
  double dVar133;
  double dVar134;
  double dVar135;
  double dVar136;
  double dVar137;
  double dVar138;
  double dVar139;
  double dVar140;
  double dVar141;
  double dVar142;
  double dVar143;
  double dVar144;
  double dVar145;
  double dVar146;
  double dVar147;
  double dVar148;
  double dVar149;
  double dVar150;
  double dVar151;
  double dVar152;
  double dVar153;
  double dVar154;
  double dVar155;
  double dVar156;
  double dVar157;
  double dVar158;
  double dVar159;
  double dVar160;
  double dVar161;
  double dVar162;
  double dVar163;
  double dVar164;
  double dVar165;
  double dVar166;
  double dVar167;
  double dVar168;
  double dVar169;
  double dVar170;
  double dVar171;
  double dVar172;
  double dVar173;
  double dVar174;
  double dVar175;
  double dVar176;
  double dVar177;
  double dVar178;
  double dVar179;
  double dVar180;
  double dVar181;
  double dVar182;
  double dVar183;
  double dVar184;
  double dVar185;
  double dVar186;
  double dVar187;
  double dVar188;
  double dVar189;
  double dVar190;
  double dVar191;
  double dVar192;
  double dVar193;
  double dVar194;
  double dVar195;
  double dVar196;
  double dVar197;
  double dVar198;
  double dVar199;
  double dVar200;
  double dVar201;
  double dVar202;
  double dVar203;
  double dVar204;
  double dVar205;
  double dVar206;
  double dVar207;
  double dVar208;
  double dVar209;
  double dVar210;
  double dVar211;
  double dVar212;
  double dVar213;
  double dVar214;
  double dVar215;
  double dVar216;
  double dVar217;
  double dVar218;
  double dVar219;
  double dVar220;
  double dVar221;
  double dVar222;
  double dVar223;
  double dVar224;
  double dVar225;
  double dVar226;
  double dVar227;
  double dVar228;
  double dVar229;
  double dVar230;
  double dVar231;
  double dVar232;
  double dVar233;
  double dVar234;
  double dVar235;
  double dVar236;
  double dVar237;
  double dVar238;
  long *in_stack_00000008;
  hyb_mgga_xc_gas22_params *params;
  double tv2tau20;
  double t1896;
  double t1895;
  double t1890;
  double t1883;
  double t1875;
  double t1874;
  double t1871;
  double t1864;
  double t1861;
  double t1857;
  double t1851;
  double t1848;
  double t1847;
  double t1844;
  double t1843;
  double t1840;
  double t1839;
  double t1836;
  double t1833;
  double t1832;
  double t1831;
  double t1829;
  double t1826;
  double t1823;
  double t1820;
  double t1819;
  double t1817;
  double t1815;
  double t1811;
  double t1806;
  double t1801;
  double t1800;
  double t1796;
  double t1795;
  double t1792;
  double t1791;
  double t1789;
  double tv2lapltau0;
  double tv2lapl20;
  double tv2sigmatau0;
  double t1787;
  double t1786;
  double t1779;
  double t1778;
  double t1775;
  double t1774;
  double t1773;
  double t1771;
  double t1764;
  double t1763;
  double t1760;
  double tv2sigmalapl0;
  double tv2sigma20;
  double t1757;
  double t1756;
  double t1752;
  double t1751;
  double t1749;
  double t1745;
  double t1741;
  double t1734;
  double t1728;
  double t1721;
  double t1720;
  double t1716;
  double t1715;
  double t1711;
  double tv2rhotau0;
  double t1705;
  double t1704;
  double t1703;
  double t1696;
  double t1695;
  double t1692;
  double t1691;
  double t1684;
  double t1678;
  double t1677;
  double t1671;
  double t1670;
  double t1667;
  double t1664;
  double t1661;
  double t1657;
  double t1650;
  double t1647;
  double t1644;
  double t1641;
  double t1640;
  double t1637;
  double t1636;
  double t1635;
  double t1634;
  double t1631;
  double t1628;
  double t1621;
  double t1620;
  double t1617;
  double t1616;
  double t1613;
  double t1609;
  double t1608;
  double t1607;
  double t1605;
  double t1604;
  double t1595;
  double t1594;
  double t1590;
  double t1585;
  double t1583;
  double t1569;
  double t1568;
  double t1561;
  double t1557;
  double t1555;
  double t1550;
  double t1549;
  double t1546;
  double t1543;
  double t1540;
  double t1539;
  double t1538;
  double t1535;
  double t1531;
  double tv2rholapl0;
  double tv2rhosigma0;
  double t1525;
  double t1524;
  double t1517;
  double t1514;
  double t1511;
  double t1508;
  double t1507;
  double t1506;
  double t1503;
  double t1502;
  double t1501;
  double t1498;
  double t1497;
  double t1496;
  double t1495;
  double t1493;
  double t1492;
  double t1488;
  double t1483;
  double t1478;
  double t1471;
  double t1470;
  double t1467;
  double t1466;
  double t1463;
  double t1451;
  double t1450;
  double t1445;
  double t1443;
  double t1438;
  double t1437;
  double t1433;
  double t1432;
  double t1428;
  double t1427;
  double t1420;
  double tv2rho20;
  double t1414;
  double t1413;
  double t1412;
  double t1409;
  double t1406;
  double t1403;
  double t1402;
  double t1399;
  double t1398;
  double t1395;
  double t1394;
  double t1393;
  double t1392;
  double t1389;
  double t1388;
  double t1387;
  double t1386;
  double t1383;
  double t1380;
  double t1379;
  double t1375;
  double t1371;
  double t1368;
  double t1358;
  double t1357;
  double t1353;
  double t1344;
  double t1343;
  double t1340;
  double t1339;
  double t1338;
  double t1337;
  double t1332;
  double t1331;
  double t1328;
  double t1327;
  double t1326;
  double t1323;
  double t1322;
  double t1321;
  double t1318;
  double t1315;
  double t1314;
  double t1313;
  double t1308;
  double t1303;
  double t1302;
  double t1301;
  double t1298;
  double t1297;
  double t1296;
  double t1292;
  double t1291;
  double t1290;
  double t1289;
  double t1288;
  double t1287;
  double t1284;
  double t1282;
  double t1273;
  double t1271;
  double t1270;
  double t1269;
  double t1265;
  double t1258;
  double t1257;
  double t1256;
  double t1255;
  double t1254;
  double t1253;
  double t1250;
  double t1249;
  double t1247;
  double t1245;
  double t1243;
  double t1242;
  double t1241;
  double t1239;
  double t1237;
  double t1236;
  double t1234;
  double t1233;
  double t1232;
  double t1231;
  double t1226;
  double t1225;
  double t1224;
  double t1223;
  double t1222;
  double t1218;
  double t1213;
  double t1212;
  double t1211;
  double t1207;
  double t1206;
  double t1203;
  double t1198;
  double t1194;
  double t1193;
  double t1190;
  double t1189;
  double t1188;
  double t1184;
  double t1182;
  double t1180;
  double t1179;
  double t1178;
  double t1175;
  double t1172;
  double t1171;
  double t1170;
  double t1168;
  double t1167;
  double t1166;
  double t1158;
  double t1156;
  double t1153;
  double t1151;
  double t1148;
  double t1145;
  double t1137;
  double t1128;
  double t1125;
  double t1122;
  double t1118;
  double t1117;
  double t1116;
  double t1114;
  double t1112;
  double t1111;
  double t1106;
  double t1104;
  double t1102;
  double t1100;
  double t1099;
  double t1096;
  double t1093;
  double t1092;
  double t1089;
  double t1085;
  double t1080;
  double t1075;
  double t1072;
  double t1071;
  double t1070;
  double t1069;
  double t1068;
  double t1067;
  double t1064;
  double t1063;
  double t1054;
  double t1053;
  double t1052;
  double t1051;
  double t1050;
  double t1047;
  double t1040;
  double t1039;
  double t1038;
  double t1037;
  double t1036;
  double t1032;
  double t1023;
  double t1022;
  double t1021;
  double t1020;
  double t1019;
  double t1016;
  double t1010;
  double t1008;
  double t1007;
  double t1006;
  double t1005;
  double t1004;
  double t1003;
  double t1002;
  double t999;
  double t997;
  double t994;
  double t992;
  double t991;
  double t989;
  double t987;
  double t986;
  double t984;
  double t983;
  double t982;
  double t980;
  double t979;
  double t978;
  double t977;
  double t976;
  double t972;
  double t970;
  double t969;
  double t968;
  double t967;
  double t966;
  double t965;
  double t963;
  double t960;
  double t957;
  double t955;
  double t950;
  double t949;
  double t946;
  double t943;
  double t942;
  double t939;
  double t938;
  double t935;
  double t931;
  double t929;
  double t928;
  double t927;
  double t923;
  double t922;
  double t920;
  double t916;
  double t915;
  double t910;
  double t906;
  double t905;
  double t901;
  double t898;
  double t887;
  double t886;
  double t878;
  double t870;
  double t867;
  double t866;
  double t865;
  double t863;
  double t858;
  double t857;
  double t852;
  double t824;
  double t823;
  double t819;
  double t815;
  double t805;
  double tvtau0;
  double t798;
  double t797;
  double t794;
  double t791;
  double t782;
  double t779;
  double t776;
  double t775;
  double t772;
  double t771;
  double t770;
  double t768;
  double t767;
  double t765;
  double t763;
  double t760;
  double t757;
  double t756;
  double t754;
  double t752;
  double t748;
  double t743;
  double t742;
  double t741;
  double t737;
  double t736;
  double t734;
  double t733;
  double t731;
  double t730;
  double tvlapl0;
  double tvsigma0;
  double t728;
  double t727;
  double t723;
  double t722;
  double t721;
  double t719;
  double t715;
  double t708;
  double t704;
  double t703;
  double t696;
  double t695;
  double t694;
  double t690;
  double t689;
  double t685;
  double t684;
  double t682;
  double t678;
  double tvrho0;
  double t675;
  double t674;
  double t671;
  double t668;
  double t667;
  double t663;
  double t660;
  double t659;
  double t658;
  double t657;
  double t656;
  double t652;
  double t648;
  double t644;
  double t640;
  double t639;
  double t638;
  double t635;
  double t634;
  double t633;
  double t632;
  double t628;
  double t627;
  double t625;
  double t623;
  double t622;
  double t621;
  double t620;
  double t616;
  double t615;
  double t613;
  double t608;
  double t607;
  double t606;
  double t601;
  double t598;
  double t597;
  double t596;
  double t594;
  double t591;
  double t590;
  double t589;
  double t587;
  double t585;
  double t584;
  double t583;
  double t582;
  double t580;
  double t579;
  double t578;
  double t573;
  double t572;
  double t568;
  double t560;
  double t559;
  double t558;
  double t554;
  double t552;
  double t550;
  double t549;
  double t548;
  double t547;
  double t543;
  double t541;
  double t539;
  double t538;
  double t536;
  double t535;
  double t534;
  double t533;
  double t530;
  double t529;
  double t528;
  double t525;
  double t524;
  double t523;
  double t520;
  double t519;
  double t516;
  double t513;
  double t509;
  double t508;
  double t503;
  double t502;
  double t496;
  double t494;
  double t490;
  double t489;
  double t484;
  double t483;
  double t482;
  double t477;
  double t476;
  double t475;
  double t471;
  double t468;
  double t467;
  double t466;
  double t461;
  double t460;
  double t459;
  double t455;
  double t454;
  double t452;
  double t451;
  double t450;
  double t448;
  double t446;
  double t444;
  double t443;
  double t441;
  double t439;
  double t438;
  double t436;
  double t435;
  double t434;
  double t433;
  double t432;
  double t429;
  double t428;
  double t427;
  double t426;
  double t423;
  double t422;
  double t420;
  double t415;
  double t414;
  double t411;
  double t410;
  double t407;
  double t406;
  double t402;
  double t401;
  double t400;
  double t399;
  double t397;
  double t396;
  double t392;
  double t391;
  double t386;
  double t385;
  double t381;
  double t378;
  double t373;
  double t369;
  double t368;
  double t364;
  double t362;
  double t358;
  double t354;
  double t350;
  double t346;
  double t342;
  double t338;
  double t337;
  double t334;
  double t333;
  double t330;
  double t329;
  double t325;
  double t323;
  double t322;
  double t318;
  double tzk0;
  double t317;
  double t316;
  double t314;
  double t313;
  double t312;
  double t310;
  double t309;
  double t308;
  double t307;
  double t305;
  double t303;
  double t302;
  double t301;
  double t300;
  double t299;
  double t297;
  double t296;
  double t295;
  double t294;
  double t293;
  double t292;
  double t291;
  double t289;
  double t287;
  double t286;
  double t285;
  double t284;
  double t282;
  double t280;
  double t275;
  double t274;
  double t271;
  double t266;
  double t264;
  double t261;
  double t258;
  double t257;
  double t254;
  double t252;
  double t249;
  double t246;
  double t245;
  double t243;
  double t241;
  double t239;
  double t234;
  double t233;
  double t232;
  double t231;
  double t230;
  double t229;
  double t226;
  double t225;
  double t223;
  double t222;
  double t221;
  double t220;
  double t219;
  double t218;
  double t217;
  double t216;
  double t215;
  double t214;
  double t213;
  double t211;
  double t210;
  double t209;
  double t208;
  double t207;
  double t205;
  double t204;
  double t200;
  double t199;
  double t197;
  double t196;
  double t195;
  double t186;
  double t185;
  double t184;
  double t181;
  double t176;
  double t172;
  double t171;
  double t168;
  double t163;
  double t161;
  double t160;
  double t156;
  double t154;
  double t152;
  double t151;
  double t148;
  double t146;
  double t144;
  double t142;
  double t141;
  double t140;
  double t139;
  double t137;
  double t134;
  double t133;
  double t131;
  double t129;
  double t126;
  double t125;
  double t124;
  double t123;
  double t119;
  double t118;
  double t116;
  double t115;
  double t114;
  double t113;
  double t112;
  double t111;
  double t109;
  double t108;
  double t107;
  double t106;
  double t105;
  double t104;
  double t103;
  double t102;
  double t101;
  double t97;
  double t96;
  double t94;
  double t93;
  double t92;
  double t91;
  double t89;
  double t88;
  double t87;
  double t86;
  double t85;
  double t83;
  double t79;
  double t76;
  double t73;
  double t72;
  double t70;
  double t69;
  double t67;
  double t65;
  double t64;
  double t63;
  double t60;
  double t59;
  double t57;
  double t54;
  double t51;
  double t48;
  double t47;
  double t45;
  double t44;
  double t42;
  double t41;
  double t38;
  double t37;
  double t36;
  double t35;
  double t34;
  double t31;
  double t29;
  double t27;
  double t26;
  double t24;
  double t23;
  double t22;
  double t21;
  double t20;
  double t19;
  double t17;
  double t16;
  double t15;
  double t14;
  double t12;
  double t11;
  double t10;
  double t9;
  double t8;
  double t7;
  double t6;
  double t5;
  double t4;
  double local_1a60;
  double local_1a58;
  double local_1a50;
  double local_1a48;
  double local_1a40;
  double local_1a38;
  double local_1a30;
  double local_1a28;
  double local_1a20;
  double local_1a18;
  double local_1a10;
  double local_1a08;
  double local_1a00;
  double local_19f8;
  double local_19f0;
  double local_19e8;
  double local_19e0;
  double local_19d0;
  double local_19c8;
  double local_19b8;
  double local_19b0;
  double local_19a8;
  double local_19a0;
  double local_1998;
  double local_1990;
  double local_1988;
  double local_1980;
  bool local_1971;
  
  pdVar8 = (double *)in_RDI[0x2f];
  dVar10 = (double)(1.0 <= (double)in_RDI[0x31]);
  local_1971 = *in_RDX / 2.0 <= (double)in_RDI[0x30] || dVar10 != 0.0;
  dVar11 = (double)local_1971;
  dVar12 = cbrt(0.3183098861837907);
  dVar13 = dVar12 * 1.4422495703074083;
  dVar14 = dVar13 * 2.519842099789747 * 1.2599210498948732;
  dVar15 = (double)(2.0 <= (double)in_RDI[0x31]);
  local_19b8 = cbrt((double)in_RDI[0x31]);
  local_19e0 = local_19b8 * (double)in_RDI[0x31];
  local_1980 = local_19e0;
  if ((dVar15 == 0.0) && (!NAN(dVar15))) {
    local_1980 = 2.5198420997897464;
  }
  dVar16 = cbrt(*in_RDX);
  dVar17 = local_1980 * dVar16;
  dVar18 = cbrt(9.0);
  dVar19 = dVar12 * dVar12;
  dVar18 = dVar18 * dVar18 * dVar19 * (double)in_RDI[4];
  dVar20 = 1.0 / dVar16;
  local_1988 = local_19b8;
  if ((dVar15 == 0.0) && (!NAN(dVar15))) {
    local_1988 = 1.2599210498948732;
  }
  local_1988 = 1.2599210498948732 / local_1988;
  local_1998 = (dVar18 * 1.4422495703074083 * dVar20 * local_1988) / 18.0;
  dVar15 = (double)(1.35 <= local_1998);
  dVar21 = (double)(1.35 < local_1998);
  local_1990 = local_1998;
  if ((dVar21 == 0.0) && (!NAN(dVar21))) {
    local_1990 = 1.35;
  }
  dVar22 = local_1990 * local_1990;
  dVar23 = dVar22 * dVar22;
  dVar24 = 1.0 / (dVar23 * dVar22);
  dVar25 = dVar23 * dVar23;
  dVar26 = (1.0 / dVar25) / dVar22;
  dVar27 = (1.0 / dVar25) / dVar23;
  dVar28 = (1.0 / dVar25) / (dVar23 * dVar22);
  dVar29 = dVar25 * dVar25;
  if ((dVar21 != 0.0) || (NAN(dVar21))) {
    local_1998 = 1.35;
  }
  dVar30 = sqrt(3.141592653589793);
  dVar31 = 1.0 / local_1998;
  dVar32 = erf(dVar31 / 2.0);
  dVar33 = local_1998 * local_1998;
  dVar34 = 1.0 / dVar33;
  dVar35 = exp(-dVar34 / 4.0);
  dVar36 = dVar35 - 1.0;
  dVar37 = -(dVar33 * 2.0) * dVar36 + (dVar35 - 1.5);
  dVar30 = local_1998 * 2.0 * dVar37 + dVar30 * dVar32;
  if ((dVar15 != 0.0) || (NAN(dVar15))) {
    local_19a0 = (((((((1.0 / dVar22) / 36.0 - (1.0 / dVar23) / 960.0) + dVar24 / 26880.0) -
                    (1.0 / dVar25) / 829440.0) + dVar26 / 28385280.0) - dVar27 / 1073479680.0) +
                 dVar28 / 44590694400.0) - (1.0 / dVar29) / 2021444812800.0;
  }
  else {
    local_19a0 = -(local_1998 * 2.6666666666666665) * dVar30 + 1.0;
  }
  dVar32 = pdVar8[1];
  dVar38 = dVar32 * *in_RCX;
  dVar39 = *in_RDX * *in_RDX;
  dVar40 = dVar16 * dVar16;
  dVar41 = (1.0 / dVar40) / dVar39;
  dVar42 = dVar41 * 1.5874010519681996;
  dVar43 = *in_RCX * 1.5874010519681996 * dVar41;
  dVar44 = dVar43 * 0.003840616724010807 + 1.0;
  dVar45 = 1.0 / dVar44;
  dVar1 = pdVar8[2];
  dVar46 = cbrt(9.869604401089358);
  dVar46 = dVar46 * dVar46 * 3.3019272488946267;
  dVar47 = *in_R9 * 1.5874010519681996;
  dVar48 = (1.0 / dVar40) / *in_RDX;
  dVar49 = dVar47 * dVar48;
  dVar50 = dVar46 * 0.3 - dVar49;
  dVar51 = dVar1 * dVar50;
  dVar52 = dVar46 * 0.3 + dVar49;
  dVar53 = 1.0 / dVar52;
  dVar54 = dVar51 * dVar53 + dVar38 * 0.003840616724010807 * dVar42 * dVar45 + *pdVar8;
  dVar55 = local_19a0 * dVar54;
  if ((dVar11 != 0.0) || (NAN(dVar11))) {
    local_19a8 = 0.0;
  }
  else {
    local_19a8 = dVar14 * -0.046875 * dVar17 * dVar55;
  }
  if ((dVar10 != 0.0) || (NAN(dVar10))) {
    local_19b0 = (double)in_RDI[0x31];
  }
  else {
    local_19b0 = 1.0;
  }
  dVar56 = dVar13 * 2.519842099789747;
  if ((dVar10 != 0.0) || (NAN(dVar10))) {
    local_19b8 = 1.0 / local_19b8;
  }
  else {
    local_19b8 = 1.0;
  }
  dVar57 = dVar56 * dVar20 * 1.2599210498948732 * local_19b8;
  dVar58 = dVar57 * 0.053425 + 1.0;
  dVar59 = sqrt(dVar57);
  dVar60 = sqrt(dVar57);
  dVar60 = dVar57 * dVar60;
  dVar61 = dVar19 * 2.080083823051904;
  dVar62 = dVar61 * 1.5874010519681996;
  dVar63 = 1.0 / dVar40;
  dVar64 = local_19b8 * local_19b8;
  dVar65 = dVar62 * dVar63 * 1.5874010519681996 * dVar64;
  dVar66 = dVar65 * 0.123235 + dVar60 * 0.204775 + dVar59 * 3.79785 + dVar57 * 0.8969;
  __x = 16.081979498692537 / dVar66 + 1.0;
  dVar67 = log(__x);
  dVar68 = dVar58 * 0.0621814 * dVar67;
  local_19c8 = local_19e0;
  if ((double)in_RDI[0x31] < 0.0) {
    local_19c8 = 0.0;
  }
  dVar69 = ((local_1980 + local_19c8) - 2.0) * 1.9236610509315362;
  dVar70 = dVar57 * 0.05137 + 1.0;
  dVar71 = dVar65 * 0.1562925 + dVar60 * 0.420775 + dVar59 * 7.05945 + dVar57 * 1.549425;
  __x_00 = 32.16395899738507 / dVar71 + 1.0;
  dVar72 = log(__x_00);
  dVar73 = dVar57 * 0.0278125 + 1.0;
  dVar60 = dVar65 * 0.1241775 + dVar60 * 0.1100325 + dVar59 * 5.1785 + dVar57 * 0.905775;
  dVar65 = 29.608749977793437 / dVar60 + 1.0;
  dVar74 = log(dVar65);
  if ((dVar11 != 0.0) || (NAN(dVar11))) {
    local_19d0 = 0.0;
  }
  else {
    local_19d0 = (local_19b0 *
                 (dVar69 * 0.0197516734986138 * dVar73 * dVar74 +
                 dVar69 * (dVar73 * dVar74 * -0.0197516734986138 +
                          dVar70 * -0.0310907 * dVar72 + dVar68) + -dVar68)) / 2.0;
  }
  dVar68 = pdVar8[3];
  dVar75 = dVar68 * *in_RCX;
  dVar76 = dVar43 * 0.46914023462026644 + 1.0;
  dVar77 = 1.0 / dVar76;
  dVar2 = pdVar8[4];
  dVar78 = dVar2 * dVar50;
  dVar3 = pdVar8[5];
  dVar79 = dVar50 * dVar50;
  dVar80 = dVar3 * dVar79;
  dVar81 = dVar52 * dVar52;
  dVar82 = 1.0 / dVar81;
  dVar4 = pdVar8[6];
  dVar83 = *in_RCX * *in_RCX;
  dVar84 = dVar83 * dVar83;
  dVar85 = dVar84 * dVar83;
  dVar86 = dVar4 * dVar85;
  dVar87 = dVar39 * dVar39;
  dVar88 = dVar87 * dVar87;
  dVar89 = dVar88 * dVar88;
  dVar90 = 1.0 / dVar89;
  dVar91 = dVar76 * dVar76;
  dVar92 = dVar91 * dVar91;
  dVar93 = (1.0 / dVar92) / dVar91;
  dVar94 = dVar90 * dVar93;
  dVar5 = pdVar8[7];
  dVar95 = dVar5 * dVar79 * dVar79;
  dVar96 = dVar81 * dVar81;
  dVar97 = 1.0 / dVar96;
  dVar98 = dVar95 * dVar97;
  dVar99 = dVar98 * 0.17058312527037534 * dVar85 * dVar90 * dVar93 +
           dVar86 * 0.17058312527037534 * dVar94 +
           dVar80 * dVar82 + dVar75 * 0.46914023462026644 * dVar42 * dVar77 + dVar78 * dVar53;
  dVar100 = local_19d0 * 2.0 * dVar99;
  dVar20 = dVar13 * 2.519842099789747 * dVar20;
  dVar101 = dVar20 * 0.053425 + 1.0;
  dVar102 = sqrt(dVar20);
  dVar103 = sqrt(dVar20);
  dVar104 = dVar61 * 1.5874010519681996 * dVar63;
  dVar105 = dVar104 * 0.123235 + dVar20 * dVar103 * 0.204775 + dVar102 * 3.79785 + dVar20 * 0.8969;
  __x_01 = 16.081979498692537 / dVar105 + 1.0;
  dVar106 = log(__x_01);
  if ((dVar10 == 0.0) && (!NAN(dVar10))) {
    local_19e0 = 1.0;
  }
  dVar107 = (local_19e0 + local_19e0 + -2.0) * 1.9236610509315362;
  dVar108 = dVar20 * 0.0278125 + 1.0;
  dVar109 = dVar104 * 0.1241775 +
            dVar20 * dVar103 * 0.1100325 + dVar102 * 5.1785 + dVar20 * 0.905775;
  __x_02 = 29.608749977793437 / dVar109 + 1.0;
  dVar110 = log(__x_02);
  dVar111 = (dVar101 * -0.0621814 * dVar106 + dVar107 * 0.0197516734986138 * dVar108 * dVar110) -
            (local_19d0 + local_19d0);
  dVar10 = pdVar8[9];
  dVar49 = dVar46 * 0.6 * dVar49;
  dVar112 = *in_R9 * *in_R9;
  dVar113 = dVar112 * 1.2599210498948732;
  dVar114 = dVar39 * *in_RDX;
  dVar115 = (1.0 / dVar16) / dVar114;
  dVar103 = dVar113 * 4.0 * dVar115;
  dVar116 = dVar49 - dVar103;
  dVar117 = dVar116 * dVar116;
  dVar118 = dVar10 * dVar117;
  dVar49 = dVar49 + dVar103;
  dVar119 = dVar49 * dVar49;
  dVar120 = 1.0 / dVar119;
  dVar103 = pdVar8[10];
  dVar121 = dVar117 * dVar117;
  dVar122 = dVar103 * dVar121 * dVar117;
  dVar123 = dVar119 * dVar119;
  dVar124 = (1.0 / dVar123) / dVar119;
  dVar104 = pdVar8[0xb];
  dVar125 = dVar104 * dVar121 * dVar117;
  dVar126 = cbrt(dVar43);
  dVar127 = dVar124 * dVar126;
  dVar6 = pdVar8[0xc];
  dVar117 = dVar6 * dVar117;
  dVar128 = dVar120 * dVar126;
  dVar129 = dVar117 * dVar128 + dVar125 * dVar127 + dVar118 * dVar120 + dVar122 * dVar124 +
            pdVar8[8];
  if ((*in_stack_00000008 != 0) && ((*(uint *)(*in_RDI + 0x40) & 1) != 0)) {
    lVar9 = in_RSI * (int)in_RDI[0xb];
    *(double *)(*in_stack_00000008 + lVar9 * 8) =
         local_19a8 * 2.0 + dVar100 + dVar111 * dVar129 +
         *(double *)(*in_stack_00000008 + lVar9 * 8);
  }
  dVar63 = local_1980 * dVar63;
  dVar130 = dVar22 * local_1990;
  dVar131 = (1.0 / dVar16) / *in_RDX;
  local_19f0 = (dVar18 * 1.4422495703074083 * dVar131 * local_1988) / 54.0;
  if ((dVar21 != 0.0) || (NAN(dVar21))) {
    local_19e8 = -local_19f0;
  }
  else {
    local_19e8 = 0.0;
  }
  dVar132 = 1.0 / (dVar23 * local_1990);
  dVar133 = 1.0 / (dVar23 * dVar130);
  dVar134 = (1.0 / dVar25) / local_1990;
  dVar135 = (1.0 / dVar25) / dVar130;
  dVar136 = (1.0 / dVar25) / (dVar23 * local_1990);
  dVar137 = (1.0 / dVar25) / (dVar23 * dVar130);
  local_1990 = (1.0 / dVar29) / local_1990;
  if ((dVar21 != 0.0) || (NAN(dVar21))) {
    local_19f0 = 0.0;
  }
  else {
    local_19f0 = -local_19f0;
  }
  dVar138 = 1.0 / (dVar33 * local_1998);
  dVar139 = -(dVar31 * local_19f0) * dVar35 +
            -(local_1998 * dVar36 * 4.0) * local_19f0 + (dVar138 * local_19f0 * dVar35) / 2.0;
  dVar140 = local_1998 * 2.0 * dVar139 + -(dVar35 * dVar34) * local_19f0 + local_19f0 * 2.0 * dVar37
  ;
  if ((dVar15 != 0.0) || (NAN(dVar15))) {
    local_19f8 = (((((((-(1.0 / dVar130) * local_19e8) / 18.0 + (dVar132 * local_19e8) / 240.0) -
                     (dVar133 * local_19e8) / 4480.0) + (dVar134 * local_19e8) / 103680.0) -
                   (dVar135 * local_19e8) / 2838528.0) + (dVar136 * local_19e8) / 89456640.0) -
                 (dVar137 * local_19e8) / 3185049600.0) + (local_1990 * local_19e8) / 126340300800.0
    ;
  }
  else {
    local_19f8 = local_19f0 * -2.6666666666666665 * dVar30 +
                 -(local_1998 * 2.6666666666666665 * dVar140);
  }
  dVar141 = (1.0 / dVar40) / dVar114;
  dVar142 = dVar141 * 1.5874010519681996;
  dVar143 = dVar32 * dVar83;
  dVar144 = (1.0 / dVar16) / (dVar87 * dVar39);
  dVar145 = 1.0 / (dVar44 * dVar44);
  dVar7 = *in_R9;
  dVar146 = dVar47 * dVar41;
  dVar147 = dVar51 * dVar82 * 1.6666666666666667 * dVar146 +
            dVar1 * dVar7 * 1.6666666666666667 * dVar42 * dVar53 +
            dVar38 * -0.010241644597362152 * dVar142 * dVar45 +
            dVar143 * 7.866846304400802e-05 * dVar144 * 1.2599210498948732 * dVar145;
  dVar148 = local_19a0 * dVar147;
  if ((dVar11 != 0.0) || (NAN(dVar11))) {
    local_1a00 = 0.0;
  }
  else {
    local_1a00 = -(dVar14 * 0.046875 * dVar17) * dVar148 +
                 -(dVar14 * 0.046875 * dVar17) * local_19f8 * dVar54 +
                 (-dVar14 * dVar63 * dVar55) / 64.0;
  }
  dVar149 = dVar131 * 1.2599210498948732;
  dVar150 = dVar56 * 0.0011073470983333333 * dVar149 * local_19b8 * dVar67;
  dVar151 = dVar66 * dVar66;
  dVar152 = dVar58 * (1.0 / dVar151);
  dVar153 = (1.0 / dVar59) * 1.4422495703074083 * dVar12;
  dVar154 = dVar131 * 2.519842099789747;
  dVar155 = local_19b8 * 1.2599210498948732;
  dVar156 = dVar153 * dVar154 * dVar155;
  dVar157 = dVar56 * dVar149 * local_19b8;
  dVar158 = sqrt(dVar57);
  dVar159 = dVar158 * 1.4422495703074083 * dVar12;
  dVar158 = dVar159 * dVar154 * dVar155;
  dVar160 = dVar62 * dVar48 * 1.5874010519681996 * dVar64;
  dVar161 = dVar160 * -0.08215666666666667 +
            dVar158 * -0.1023875 + dVar156 * -0.632975 + -(dVar157 * 0.29896666666666666);
  dVar162 = 1.0 / __x;
  dVar163 = dVar152 * 1.0 * dVar161 * dVar162;
  dVar164 = dVar71 * dVar71;
  dVar165 = dVar70 * (1.0 / dVar164);
  dVar166 = dVar160 * -0.104195 + dVar158 * -0.2103875 + dVar156 * -1.176575 + -(dVar157 * 0.516475)
  ;
  dVar167 = 1.0 / __x_00;
  dVar168 = dVar60 * dVar60;
  dVar169 = 1.0 / dVar168;
  dVar160 = dVar160 * -0.082785 +
            dVar158 * -0.05501625 + dVar156 * -0.8630833333333333 + -(dVar157 * 0.301925);
  dVar156 = 1.0 / dVar65;
  dVar157 = dVar69 * dVar73;
  dVar158 = dVar169 * dVar160 * dVar156;
  if ((dVar11 != 0.0) || (NAN(dVar11))) {
    local_1a08 = 0.0;
  }
  else {
    local_1a08 = (local_19b0 *
                 (-(dVar157 * 0.5848223622634646) * dVar158 +
                 -(dVar69 * dVar13 * 0.00018311447306006544 * dVar154) * dVar155 * dVar74 +
                 dVar69 * (dVar73 * dVar169 * 0.5848223622634646 * dVar160 * dVar156 +
                          dVar56 * 0.00018311447306006544 * dVar149 * local_19b8 * dVar74 +
                          (((dVar56 * 0.0005323764196666666 * dVar149 * local_19b8 * dVar72 +
                            dVar165 * 1.0 * dVar166 * dVar167) - dVar150) - dVar163)) +
                 dVar150 + dVar163)) / 2.0;
  }
  dVar170 = dVar68 * dVar83;
  dVar171 = 1.0 / dVar91;
  dVar150 = *in_R9;
  dVar172 = dVar3 * dVar50;
  dVar173 = 1.0 / (dVar81 * dVar52);
  dVar163 = *in_RDX;
  dVar174 = 1.0 / (dVar89 * dVar163);
  dVar175 = dVar83 * *in_RCX;
  dVar176 = dVar84 * dVar175;
  dVar177 = dVar4 * dVar176;
  dVar178 = (1.0 / dVar40) / (dVar89 * dVar114);
  dVar179 = (1.0 / dVar92) / (dVar91 * dVar76);
  dVar180 = dVar178 * dVar179 * 1.5874010519681996;
  dVar50 = dVar5 * dVar79 * dVar50;
  dVar181 = dVar50 * dVar97 * dVar85;
  dVar182 = (1.0 / dVar40) / (dVar89 * dVar39);
  dVar183 = dVar182 * dVar93 * dVar47;
  dVar52 = (1.0 / dVar96) / dVar52;
  dVar184 = dVar95 * dVar52 * dVar85;
  dVar185 = dVar179 * 1.5874010519681996;
  dVar186 = dVar98 * 1.2804385185856348 * dVar176 * dVar178 * dVar185 +
            -(dVar98 * 2.7293300043260054 * dVar85 * dVar174) * dVar93 +
            dVar184 * 1.1372208351358355 * dVar183 +
            dVar181 * 1.1372208351358355 * dVar183 +
            dVar177 * 1.2804385185856348 * dVar180 +
            -(dVar86 * 2.7293300043260054) * dVar174 * dVar93 +
            dVar80 * dVar173 * 3.3333333333333335 * dVar146 +
            dVar172 * dVar82 * 3.3333333333333335 * dVar146 +
            dVar78 * dVar82 * 1.6666666666666667 * dVar146 +
            dVar2 * dVar150 * 1.6666666666666667 * dVar42 * dVar53 +
            dVar75 * -1.2510406256540438 * dVar142 * dVar77 +
            dVar170 * 1.1738269852776462 * dVar144 * 1.2599210498948732 * dVar171;
  dVar187 = local_19d0 * dVar186;
  dVar188 = dVar105 * dVar105;
  dVar189 = dVar101 * (1.0 / dVar188);
  dVar190 = (1.0 / dVar102) * 1.4422495703074083;
  dVar12 = dVar12 * 2.519842099789747;
  dVar191 = dVar190 * dVar12 * dVar131;
  dVar192 = dVar13 * dVar154;
  dVar193 = sqrt(dVar20);
  dVar194 = dVar193 * 1.4422495703074083 * dVar12 * dVar131;
  dVar195 = dVar61 * 1.5874010519681996 * dVar48;
  dVar196 = dVar195 * -0.08215666666666667 +
            dVar194 * -0.1023875 + dVar191 * -0.632975 + -(dVar192 * 0.29896666666666666);
  dVar197 = 1.0 / __x_01;
  dVar108 = dVar107 * dVar108;
  dVar198 = dVar109 * dVar109;
  dVar191 = dVar195 * -0.082785 +
            dVar194 * -0.05501625 + dVar191 * -0.8630833333333333 + -(dVar192 * 0.301925);
  dVar194 = 1.0 / __x_02;
  dVar195 = (1.0 / dVar198) * dVar191 * dVar194;
  dVar199 = (-(dVar108 * 0.5848223622634646) * dVar195 +
            -(dVar107 * 1.4422495703074083 * 0.00018311447306006544 * dVar12 * dVar131) * dVar110 +
            dVar13 * 0.0011073470983333333 * dVar154 * dVar106 + dVar189 * 1.0 * dVar196 * dVar197)
            - (local_1a08 + local_1a08);
  dVar200 = dVar199 * dVar129;
  dVar201 = dVar10 * dVar116;
  dVar202 = (1.0 / dVar16) / dVar87;
  dVar203 = dVar113 * 13.333333333333334 * dVar202;
  dVar204 = -(dVar46 * dVar146) + dVar203;
  dVar205 = 1.0 / (dVar119 * dVar49);
  dVar203 = -(dVar46 * dVar146) - dVar203;
  dVar146 = dVar103 * dVar121 * dVar116;
  dVar119 = (1.0 / dVar123) / (dVar119 * dVar49);
  dVar206 = dVar104 * dVar121 * dVar116;
  dVar207 = dVar119 * dVar126;
  dVar208 = dVar125 * dVar124;
  dVar209 = 1.0 / (dVar126 * dVar126);
  dVar49 = *in_RCX;
  dVar210 = dVar209 * dVar49 * dVar142;
  dVar116 = dVar6 * dVar116;
  dVar211 = dVar205 * dVar126;
  dVar212 = dVar117 * dVar120;
  dVar213 = -(dVar212 * 0.8888888888888888) * dVar210 +
            -(dVar117 * 2.0) * dVar211 * dVar203 +
            dVar116 * 2.0 * dVar128 * dVar204 +
            -(dVar208 * 0.8888888888888888) * dVar210 +
            -(dVar125 * 6.0 * dVar207) * dVar203 +
            dVar206 * 6.0 * dVar127 * dVar204 +
            -(dVar122 * 6.0 * dVar119) * dVar203 +
            dVar146 * 6.0 * dVar124 * dVar204 +
            dVar201 * 2.0 * dVar120 * dVar204 + -(dVar118 * 2.0 * dVar205 * dVar203);
  dVar210 = dVar111 * dVar213;
  if ((in_stack_00000008[1] != 0) && ((*(uint *)(*in_RDI + 0x40) & 2) != 0)) {
    lVar9 = in_RSI * *(int *)((long)in_RDI + 0x5c);
    *(double *)(in_stack_00000008[1] + lVar9 * 8) =
         *in_RDX * (dVar187 + dVar187 + local_1a00 + local_1a00 + local_1a08 * dVar99 * 2.0 +
                    dVar200 + dVar210) + local_19a8 * 2.0 + dVar100 + dVar111 * dVar129 +
         *(double *)(in_stack_00000008[1] + lVar9 * 8);
  }
  dVar100 = *in_RDX;
  dVar214 = (1.0 / dVar16) / (dVar87 * dVar100);
  dVar215 = dVar214 * 1.2599210498948732;
  dVar216 = dVar32 * 1.5874010519681996 * 0.003840616724010807 * dVar41 * dVar45 +
            -(dVar38 * 2.9500673641503008e-05 * dVar215 * dVar145);
  dVar217 = local_19a0 * dVar216;
  if ((dVar11 != 0.0) || (NAN(dVar11))) {
    local_1a10 = 0.0;
  }
  else {
    local_1a10 = dVar14 * -0.046875 * dVar17 * dVar217;
  }
  dVar218 = dVar84 * *in_RCX;
  dVar219 = dVar4 * dVar218;
  dVar220 = dVar182 * dVar179 * 1.5874010519681996;
  dVar221 = -(dVar98 * 0.4801644444696131 * dVar85 * dVar182) * dVar185 +
            dVar98 * 1.023498751622252 * dVar218 * dVar90 * dVar93 +
            -(dVar86 * 0.4801644444696131) * dVar220 +
            dVar219 * 1.023498751622252 * dVar94 +
            dVar68 * 1.5874010519681996 * 0.46914023462026644 * dVar41 * dVar77 +
            -(dVar75 * 0.44018511947911726 * dVar215 * dVar171);
  dVar222 = local_19d0 * 2.0 * dVar221;
  dVar223 = dVar209 * 1.5874010519681996;
  dVar224 = (dVar208 * dVar223 * dVar41) / 3.0 + (dVar212 * dVar223 * dVar41) / 3.0;
  dVar225 = dVar111 * dVar224;
  if ((in_stack_00000008[2] != 0) && ((*(uint *)(*in_RDI + 0x40) & 2) != 0)) {
    lVar9 = in_RSI * (int)in_RDI[0xc];
    *(double *)(in_stack_00000008[2] + lVar9 * 8) =
         *in_RDX * (local_1a10 * 2.0 + dVar222 + dVar225) +
         *(double *)(in_stack_00000008[2] + lVar9 * 8);
  }
  if (((in_stack_00000008[3] != 0) && ((*(uint *)(*in_RDI + 0x40) & 0x8000) != 0)) &&
     ((*(uint *)(*in_RDI + 0x40) & 2) != 0)) {
    lVar9 = in_RSI * *(int *)((long)in_RDI + 100);
    *(double *)(in_stack_00000008[3] + lVar9 * 8) =
         *(double *)(in_stack_00000008[3] + lVar9 * 8) + 0.0;
  }
  dVar226 = dVar82 * 1.5874010519681996 * dVar48;
  dVar227 = -dVar51 * dVar226 + -(dVar1 * 1.5874010519681996 * dVar48 * dVar53);
  dVar228 = local_19a0 * dVar227;
  if ((dVar11 != 0.0) || (NAN(dVar11))) {
    local_1a18 = 0.0;
  }
  else {
    local_1a18 = dVar14 * -0.046875 * dVar17 * dVar228;
  }
  dVar229 = dVar50 * dVar97;
  dVar163 = (1.0 / dVar40) / (dVar89 * dVar163);
  dVar230 = dVar93 * 1.5874010519681996;
  dVar231 = dVar85 * dVar163 * dVar230;
  dVar232 = dVar95 * dVar52;
  dVar226 = -(dVar232 * 0.6823325010815013) * dVar231 +
            -(dVar229 * 0.6823325010815013) * dVar231 +
            -(dVar80 * 2.0 * dVar173 * 1.5874010519681996) * dVar48 +
            -(dVar172 * 2.0) * dVar226 +
            -(dVar2 * 1.5874010519681996) * dVar48 * dVar53 + -(dVar78 * dVar226);
  dVar231 = local_19d0 * 2.0 * dVar226;
  dVar233 = dVar46 * 0.6 * dVar48 * 1.5874010519681996;
  dVar234 = *in_R9 * 1.2599210498948732;
  dVar235 = dVar234 * 8.0 * dVar115;
  dVar236 = dVar233 - dVar235;
  dVar233 = dVar233 + dVar235;
  dVar235 = dVar116 * 2.0 * dVar128 * dVar236 +
            dVar146 * 6.0 * dVar124 * dVar236 +
            dVar201 * 2.0 * dVar120 * dVar236 +
            -(dVar117 * 2.0) * dVar211 * dVar233 +
            -(dVar122 * 6.0) * dVar119 * dVar233 +
            -(dVar118 * 2.0) * dVar205 * dVar233 +
            dVar125 * -6.0 * dVar207 * dVar233 + dVar206 * 6.0 * dVar127 * dVar236;
  dVar237 = dVar111 * dVar235;
  if (((in_stack_00000008[4] != 0) && ((*(uint *)(*in_RDI + 0x40) & 0x10000) != 0)) &&
     ((*(uint *)(*in_RDI + 0x40) & 2) != 0)) {
    lVar9 = in_RSI * (int)in_RDI[0xd];
    *(double *)(in_stack_00000008[4] + lVar9 * 8) =
         *in_RDX * (local_1a18 * 2.0 + dVar231 + dVar237) +
         *(double *)(in_stack_00000008[4] + lVar9 * 8);
  }
  local_19e8 = local_19e8 * local_19e8;
  dVar238 = (1.0 / dVar16) / dVar39;
  local_1a28 = dVar18 * 0.024691358024691357 * 1.4422495703074083 * dVar238 * local_1988;
  local_1a20 = local_1a28;
  if ((dVar21 == 0.0) && (!NAN(dVar21))) {
    local_1a20 = 0.0;
  }
  local_1a30 = (((((((((((((1.0 / dVar23) * local_19e8) / 6.0 -
                         ((1.0 / dVar130) * local_1a20) / 18.0) - (dVar24 * local_19e8) / 48.0) +
                        (dVar132 * local_1a20) / 240.0 + ((1.0 / dVar25) * local_19e8) / 640.0) -
                      (dVar133 * local_1a20) / 4480.0) - (dVar26 * local_19e8) / 11520.0) +
                     (dVar134 * local_1a20) / 103680.0 + (dVar27 * local_19e8) / 258048.0) -
                   (dVar135 * local_1a20) / 2838528.0) - (dVar28 * local_19e8) / 6881280.0) +
                  (dVar136 * local_1a20) / 89456640.0 + ((1.0 / dVar29) * local_19e8) / 212336640.0)
                - (dVar137 * local_1a20) / 3185049600.0) -
               (((1.0 / dVar29) / dVar22) * local_19e8) / 7431782400.0) +
               (local_1990 * local_1a20) / 126340300800.0;
  if ((dVar21 != 0.0) || (NAN(dVar21))) {
    local_1a28 = 0.0;
  }
  dVar18 = dVar33 * dVar33;
  dVar21 = local_19f0 * local_19f0;
  if ((dVar15 == 0.0) && (!NAN(dVar15))) {
    local_1a30 = -(local_1998 * 2.6666666666666665) *
                 (local_1998 * 2.0 *
                  (-(dVar31 * local_1a28) * dVar35 +
                  -(local_1998 * dVar36 * 4.0) * local_1a28 +
                  -(dVar34 * dVar21) * dVar35 +
                  -(dVar21 * 4.0) * dVar36 +
                  (1.0 / dVar18) * -2.0 * dVar21 * dVar35 + (dVar138 * local_1a28 * dVar35) / 2.0 +
                  (((1.0 / dVar18) / dVar33) * dVar21 * dVar35) / 4.0) +
                 local_19f0 * 4.0 * dVar139 +
                 local_1a28 * 2.0 * dVar37 +
                 -(dVar35 * dVar34) * local_1a28 +
                 dVar35 * dVar138 * 2.0 * dVar21 +
                 (-(((1.0 / dVar18) / local_1998) * dVar21) * dVar35) / 2.0) +
                 local_1a28 * -2.6666666666666665 * dVar30 +
                 -(local_19f0 * 5.333333333333333 * dVar140);
  }
  dVar22 = ((1.0 / dVar40) / dVar87) * 1.5874010519681996;
  dVar21 = ((1.0 / dVar16) / (dVar87 * dVar114)) * 1.2599210498948732;
  dVar15 = 1.0 / (dVar88 * dVar39);
  dVar44 = (1.0 / (dVar44 * dVar44)) / dVar44;
  dVar215 = dVar215 * dVar82;
  dVar18 = dVar113 * dVar214;
  dVar23 = dVar47 * dVar141;
  if ((dVar11 != 0.0) || (NAN(dVar11))) {
    local_1a38 = 0.0;
  }
  else {
    local_1a38 = -(dVar14 * 0.046875 * dVar17) *
                 local_19a0 *
                 (-(dVar51 * dVar82 * 4.444444444444445) * dVar23 +
                 dVar51 * dVar173 * 11.11111111111111 * dVar18 +
                 dVar1 * dVar112 * 11.11111111111111 * dVar215 +
                 -(dVar1 * dVar7 * 4.444444444444445) * dVar142 * dVar53 +
                 dVar32 * dVar175 * 3.2227777580697954e-06 * dVar15 * dVar44 +
                 dVar38 * 0.037552696856994555 * dVar22 * dVar45 +
                 -(dVar143 * 0.0007080161673960722 * dVar21 * dVar145)) +
                 -(dVar14 * 0.09375 * dVar17) * local_19f8 * dVar147 +
                 -(dVar14 * 0.046875 * dVar17) * local_1a30 * dVar54 +
                 (((dVar14 * local_1980 * dVar48 * dVar55) / 96.0 -
                  (dVar14 * dVar63 * local_19f8 * dVar54) / 32.0) -
                 (dVar14 * dVar63 * dVar148) / 32.0);
  }
  dVar24 = dVar238 * 1.2599210498948732;
  dVar25 = dVar56 * 0.0014764627977777779 * dVar24 * local_19b8 * dVar67;
  dVar26 = dVar192 * 0.035616666666666665 * dVar155 * (1.0 / dVar151) * dVar161 * dVar162;
  dVar27 = dVar58 * (1.0 / (dVar151 * dVar66)) * 2.0 * dVar161 * dVar161 * dVar162;
  dVar33 = dVar41 * 1.5874010519681996 * dVar64 * 1.5874010519681996;
  dVar28 = ((1.0 / dVar59) / dVar57) * 2.080083823051904 * dVar19 * dVar33;
  dVar29 = dVar238 * 2.519842099789747;
  dVar153 = dVar153 * dVar29 * dVar155;
  dVar30 = dVar56 * dVar24 * local_19b8;
  dVar31 = sqrt(dVar57);
  dVar33 = (1.0 / dVar31) * 2.080083823051904 * dVar19 * dVar33;
  dVar159 = dVar159 * dVar29 * dVar155;
  dVar64 = dVar62 * dVar42 * dVar64;
  dVar162 = dVar152 * 1.0 *
            (dVar64 * 0.1369277777777778 +
            dVar159 * 0.13651666666666668 +
            dVar33 * 0.06825833333333334 +
            dVar30 * 0.3986222222222222 +
            dVar28 * -0.4219833333333333 + dVar153 * 0.8439666666666666) * dVar162;
  dVar31 = dVar58 * (1.0 / (dVar151 * dVar151)) * 16.081979498692537 *
           dVar161 * dVar161 * (1.0 / (__x * __x));
  dVar34 = 1.0 / (dVar168 * dVar60);
  dVar160 = dVar160 * dVar160;
  dVar35 = dVar64 * 0.137975 +
           dVar159 * 0.073355 +
           dVar33 * 0.0366775 +
           dVar30 * 0.4025666666666667 + dVar28 * -0.5753888888888888 + dVar153 * 1.1507777777777777
  ;
  dVar36 = 1.0 / (dVar168 * dVar168);
  dVar37 = 1.0 / (dVar65 * dVar65);
  if ((dVar11 != 0.0) || (NAN(dVar11))) {
    local_1a40 = 0.0;
  }
  else {
    local_1a40 = (local_19b0 *
                 (-(dVar157 * 17.315859105681465) * dVar36 * dVar160 * dVar37 +
                 -(dVar157 * 0.5848223622634646) * dVar169 * dVar35 * dVar156 +
                 dVar157 * 1.1696447245269292 * dVar34 * dVar160 * dVar156 +
                 dVar69 * dVar56 * 0.01084358130030174 * dVar149 * local_19b8 * dVar158 +
                 dVar69 * dVar13 * 0.00024415263074675396 * dVar29 * dVar155 * dVar74 +
                 dVar69 * (dVar73 * dVar36 * 17.315859105681465 * dVar160 * dVar37 +
                          dVar73 * dVar169 * 0.5848223622634646 * dVar35 * dVar156 +
                          -(dVar73 * dVar34 * 1.1696447245269292) * dVar160 * dVar156 +
                          -(dVar192 * 0.01084358130030174) * dVar155 * dVar158 +
                          -(dVar56 * 0.00024415263074675396 * dVar24) * local_19b8 * dVar74 +
                          (((dVar70 * (1.0 / (dVar164 * dVar164)) * 32.16395899738507 *
                             dVar166 * dVar166 * (1.0 / (__x_00 * __x_00)) +
                             dVar165 * 1.0 *
                             (dVar64 * 0.17365833333333333 +
                             dVar159 * 0.2805166666666667 +
                             dVar33 * 0.14025833333333335 +
                             dVar30 * 0.6886333333333333 +
                             dVar28 * -0.7843833333333333 + dVar153 * 1.5687666666666666) * dVar167
                             + -(dVar70 * (1.0 / (dVar164 * dVar71)) * 2.0) *
                               dVar166 * dVar166 * dVar167 +
                               dVar56 * -0.0007098352262222222 * dVar24 * local_19b8 * dVar72 +
                               -(dVar192 * 0.03424666666666667 *
                                dVar155 * (1.0 / dVar164) * dVar166 * dVar167) + dVar25 + dVar26 +
                            dVar27) - dVar162) - dVar31)) +
                 ((-dVar25 - dVar26) - dVar27) + dVar162 + dVar31)) / 2.0;
  }
  dVar24 = (1.0 / dVar40) / (dVar89 * dVar87);
  dVar25 = (1.0 / dVar16) / (dVar89 * dVar87 * dVar114);
  dVar26 = 1.0 / (dVar92 * dVar92);
  dVar27 = dVar26 * 1.2599210498948732;
  dVar28 = 1.0 / (dVar89 * dVar39);
  dVar30 = dVar5 * dVar79 * dVar97 * dVar85;
  dVar31 = (1.0 / dVar16) / (dVar89 * dVar87 * dVar100);
  dVar113 = dVar31 * dVar93 * dVar113;
  dVar33 = dVar50 * dVar52 * dVar85;
  dVar34 = (1.0 / dVar16) / (dVar89 * dVar87 * dVar39);
  dVar35 = dVar34 * dVar179 * dVar234;
  dVar81 = (1.0 / dVar96) / dVar81;
  dVar36 = dVar95 * dVar81 * dVar85;
  dVar47 = dVar178 * dVar93 * dVar47;
  dVar37 = 1.0 / (dVar91 * dVar76);
  dVar15 = local_19d0 *
           (dVar3 * dVar112 * 11.11111111111111 * dVar215 +
            dVar2 * dVar112 * 11.11111111111111 * dVar215 +
            -(dVar170 * 10.564442867498816 * dVar21) * dVar171 +
            dVar98 * 46.39861007354209 * dVar85 * dVar28 * dVar93 +
            -(dVar80 * dVar173 * 8.88888888888889) * dVar23 +
            -(dVar172 * dVar82 * 8.88888888888889) * dVar23 +
            -(dVar78 * dVar82 * 4.444444444444445) * dVar23 +
            dVar80 * dVar97 * 33.333333333333336 * dVar18 +
            dVar172 * dVar173 * 44.44444444444444 * dVar18 +
            dVar78 * dVar173 * 11.11111111111111 * dVar18 +
            dVar98 * -45.66897382955431 * dVar176 * dVar24 * dVar185 +
            dVar98 * 22.426328475640737 * dVar84 * dVar84 * dVar25 * dVar27 +
           dVar68 * dVar175 * 5.874020984285386 * dVar15 * dVar37 +
           dVar86 * 46.39861007354209 * dVar28 * dVar93 +
           -(dVar181 * 39.4236556180423) * dVar47 +
           -(dVar184 * 39.4236556180423) * dVar47 +
           dVar95 * dVar52 * dVar176 * 34.1450271622836 * dVar35 +
           dVar36 * 18.953680585597258 * dVar113 +
           dVar50 * dVar97 * dVar176 * 34.1450271622836 * dVar35 +
           dVar33 * 30.325888936955614 * dVar113 +
           dVar30 * 11.372208351358355 * dVar113 +
           -(dVar2 * dVar150 * 4.444444444444445) * dVar142 * dVar53 +
           dVar75 * 4.587148960731494 * dVar22 * dVar77 +
           dVar177 * -45.66897382955431 * dVar24 * dVar179 * 1.5874010519681996 +
           dVar4 * dVar84 * dVar84 * 22.426328475640737 * dVar25 * dVar26 * 1.2599210498948732);
  dVar24 = dVar19 * 1.5874010519681996 * dVar41;
  dVar19 = ((1.0 / dVar102) / dVar20) * 2.080083823051904 * dVar24;
  dVar190 = dVar190 * dVar12 * dVar238;
  dVar20 = sqrt(dVar20);
  dVar24 = (1.0 / dVar20) * 2.080083823051904 * dVar24;
  dVar20 = dVar193 * 1.4422495703074083 * dVar12 * dVar238;
  dVar61 = dVar61 * dVar41 * 1.5874010519681996;
  dVar213 = dVar199 * dVar213;
  dVar43 = (1.0 / (dVar126 * dVar126)) / dVar43;
  dVar21 = dVar43 * dVar83 * dVar21;
  dVar22 = dVar209 * dVar49 * dVar22;
  dVar25 = dVar116 * dVar205;
  dVar28 = dVar126 * dVar204 * dVar203;
  dVar35 = dVar206 * dVar119;
  dVar39 = 1.0 / dVar123;
  dVar40 = dVar203 * dVar203;
  dVar103 = dVar103 * dVar121;
  dVar48 = dVar204 * dVar204;
  dVar54 = 1.0 / (dVar123 * dVar123);
  dVar23 = dVar46 * 2.6666666666666665 * dVar23;
  dVar55 = dVar23 - dVar18 * 57.77777777777778;
  dVar23 = dVar23 + dVar18 * 57.77777777777778;
  dVar104 = dVar104 * dVar121;
  dVar18 = dVar206 * dVar124 * dVar209;
  dVar49 = dVar204 * *in_RCX * dVar142;
  dVar47 = dVar125 * dVar119 * dVar209;
  dVar57 = dVar203 * *in_RCX * dVar142;
  dVar58 = dVar116 * dVar120 * dVar209;
  dVar59 = dVar117 * dVar205 * dVar209;
  if ((in_stack_00000008[5] != 0) && ((*(uint *)(*in_RDI + 0x40) & 4) != 0)) {
    lVar9 = in_RSI * *(int *)((long)in_RDI + 0x6c);
    *(double *)(in_stack_00000008[5] + lVar9 * 8) =
         *in_RDX * (dVar213 + dVar213 +
                    dVar15 + dVar15 +
                    local_1a08 * dVar186 * 4.0 + local_1a38 + local_1a38 + local_1a40 * dVar99 * 2.0
                    + ((-(dVar108 * 17.315859105681465) *
                        (1.0 / (dVar198 * dVar198)) * dVar191 * dVar191 * (1.0 / (__x_02 * __x_02))
                       + -(dVar108 * 0.5848223622634646) *
                         (1.0 / dVar198) *
                         (dVar61 * 0.137975 +
                         dVar20 * 0.073355 +
                         dVar24 * 0.0366775 +
                         dVar13 * dVar29 * 0.4025666666666667 +
                         dVar19 * -0.5753888888888888 + dVar190 * 1.1507777777777777) * dVar194 +
                         dVar108 * 1.1696447245269292 *
                         (1.0 / (dVar198 * dVar109)) * dVar191 * dVar191 * dVar194 +
                         dVar107 * dVar13 * 0.01084358130030174 * dVar154 * dVar195 +
                         dVar107 * 1.4422495703074083 * 0.00024415263074675396 * dVar12 * dVar238 *
                         dVar110 + dVar101 * (1.0 / (dVar188 * dVar188)) * 16.081979498692537 *
                                   dVar196 * dVar196 * (1.0 / (__x_01 * __x_01)) +
                                   dVar189 * 1.0 *
                                   (dVar61 * 0.1369277777777778 +
                                   dVar20 * 0.13651666666666668 +
                                   dVar24 * 0.06825833333333334 +
                                   dVar13 * dVar29 * 0.3986222222222222 +
                                   dVar19 * -0.4219833333333333 + dVar190 * 0.8439666666666666) *
                                   dVar197 + -(dVar101 * (1.0 / (dVar188 * dVar105)) * 2.0) *
                                             dVar196 * dVar196 * dVar197 +
                                             dVar13 * -0.0014764627977777779 * dVar29 * dVar106 +
                                             -(dVar56 * 0.035616666666666665 *
                                               dVar131 * (1.0 / dVar188) * dVar196 * dVar197)) -
                      (local_1a40 + local_1a40)) * dVar129 +
                   dVar111 * (-(dVar201 * 8.0 * dVar205 * dVar204) * dVar203 +
                              -(dVar122 * 6.0 * dVar119) * dVar23 +
                              dVar146 * 6.0 * dVar124 * dVar55 +
                              -(dVar118 * 2.0) * dVar205 * dVar23 +
                              dVar201 * 2.0 * dVar120 * dVar55 +
                              dVar122 * 42.0 * dVar54 * dVar40 +
                              dVar103 * 30.0 * dVar124 * dVar48 +
                              dVar118 * 6.0 * dVar39 * dVar40 +
                              -(dVar35 * 72.0) * dVar28 +
                              -(dVar25 * 8.0) * dVar28 +
                              dVar212 * 3.259259259259259 * dVar22 +
                              dVar208 * 3.259259259259259 * dVar22 +
                              dVar208 * -3.1604938271604937 * dVar21 +
                              -(dVar212 * 3.1604938271604937 * dVar21) +
                             dVar10 * dVar48 * 2.0 * dVar120 +
                             dVar6 * dVar48 * 2.0 * dVar128 +
                             dVar59 * 3.5555555555555554 * dVar57 +
                             -(dVar58 * 3.5555555555555554) * dVar49 +
                             dVar47 * 10.666666666666666 * dVar57 +
                             -(dVar18 * 10.666666666666666) * dVar49 +
                             dVar116 * 2.0 * dVar128 * dVar55 +
                             dVar117 * 6.0 * dVar39 * dVar126 * dVar40 +
                             dVar125 * 42.0 * dVar54 * dVar126 * dVar40 +
                             dVar104 * 30.0 * dVar127 * dVar48 +
                             -(dVar117 * 2.0) * dVar211 * dVar23 +
                             -(dVar125 * 6.0 * dVar207) * dVar23 +
                             dVar146 * -72.0 * dVar119 * dVar204 * dVar203 +
                             dVar206 * 6.0 * dVar127 * dVar55)) +
         dVar210 + dVar210 +
         dVar200 + dVar200 + dVar187 * 4.0 + local_1a00 * 4.0 + local_1a08 * dVar99 * 4.0 +
         *(double *)(in_stack_00000008[5] + lVar9 * 8);
  }
  dVar13 = 1.0 / (dVar88 * *in_RDX);
  if ((dVar11 != 0.0) || (NAN(dVar11))) {
    local_1a48 = 0.0;
  }
  else {
    local_1a48 = -(dVar14 * 0.046875 * dVar17) *
                 local_19a0 *
                 (-(dVar143 * 1.2085416592761732e-06 * dVar13) * dVar44 +
                 dVar32 * 1.5874010519681996 * -0.010241644597362152 * dVar141 * dVar45 +
                 dVar32 * 1.2599210498948732 * 0.00023600538913202406 * dVar144 * dVar145 * *in_RCX)
                 + -(dVar14 * 0.046875 * dVar17) * local_19f8 * dVar216 +
                   (-dVar14 * dVar63 * dVar217) / 64.0;
  }
  dVar15 = dVar31 * dVar179 * dVar234;
  dVar13 = local_19d0 *
           (-(dVar98 * 8.409873178365276 * dVar176 * dVar34) * dVar27 +
           -(dVar184 * 6.402192592928174) * dVar15 +
           -(dVar181 * 6.402192592928174) * dVar15 +
           dVar98 * 16.645700741613254 * dVar85 * dVar178 * dVar185 +
           -(dVar98 * 16.375980025956032 * dVar218 * dVar174) * dVar93 +
           dVar95 * dVar52 * dVar218 * 6.823325010815013 * dVar183 +
           dVar50 * dVar97 * dVar218 * 6.823325010815013 * dVar183 +
           -(dVar177 * 8.409873178365276) * dVar34 * dVar26 * 1.2599210498948732 +
           dVar86 * 16.645700741613254 * dVar180 +
           -(dVar219 * 16.375980025956032) * dVar174 * dVar93 +
           -(dVar170 * 2.2027578691070198 * dVar13) * dVar37 +
           dVar68 * 1.5874010519681996 * -1.2510406256540438 * dVar141 * dVar77 +
           dVar68 * 1.2599210498948732 * 3.521480955832938 * dVar144 * dVar171 * *in_RCX);
  dVar15 = dVar206 * dVar124;
  dVar12 = dVar223 * dVar41 * dVar204;
  dVar19 = dVar125 * dVar119;
  dVar20 = dVar223 * dVar41 * dVar203;
  dVar43 = dVar43 * 1.2599210498948732;
  dVar21 = dVar43 * dVar144 * *in_RCX;
  dVar22 = dVar116 * dVar120;
  dVar23 = dVar117 * dVar205;
  if ((in_stack_00000008[6] != 0) && ((*(uint *)(*in_RDI + 0x40) & 4) != 0)) {
    lVar9 = in_RSI * (int)in_RDI[0xe];
    *(double *)(in_stack_00000008[6] + lVar9 * 8) =
         *in_RDX * (dVar13 + dVar13 + local_1a48 + local_1a48 + local_1a08 * dVar221 * 2.0 +
                    dVar199 * dVar224 +
                   dVar111 * (-(dVar212 * 0.8888888888888888) * dVar223 * dVar141 +
                             dVar212 * 1.1851851851851851 * dVar21 +
                             -(dVar23 * 0.6666666666666666) * dVar20 +
                             dVar22 * 0.6666666666666666 * dVar12 +
                             -(dVar208 * 0.8888888888888888) * dVar223 * dVar141 +
                             dVar208 * 1.1851851851851851 * dVar21 +
                             dVar15 * 2.0 * dVar12 + -(dVar19 * 2.0 * dVar20))) +
         local_1a10 * 2.0 + dVar222 + dVar225 + *(double *)(in_stack_00000008[6] + lVar9 * 8);
  }
  if (((in_stack_00000008[7] != 0) && ((*(uint *)(*in_RDI + 0x40) & 0x8000) != 0)) &&
     ((*(uint *)(*in_RDI + 0x40) & 4) != 0)) {
    lVar9 = in_RSI * *(int *)((long)in_RDI + 0x74);
    *(double *)(in_stack_00000008[7] + lVar9 * 8) =
         *(double *)(in_stack_00000008[7] + lVar9 * 8) + 0.0;
  }
  dVar13 = dVar202 * dVar82 * *in_R9;
  dVar12 = dVar234 * dVar202;
  dVar20 = dVar82 * 1.5874010519681996 * dVar41;
  if ((dVar11 != 0.0) || (NAN(dVar11))) {
    local_1a50 = 0.0;
  }
  else {
    local_1a50 = -(dVar14 * 0.046875 * dVar17) *
                 local_19a0 *
                 (dVar51 * 1.6666666666666667 * dVar20 +
                 -(dVar51 * dVar173 * 6.666666666666667) * dVar12 +
                 dVar1 * 1.5874010519681996 * 1.6666666666666667 * dVar41 * dVar53 +
                 -(dVar1 * 1.2599210498948732 * 6.666666666666667 * dVar13)) +
                 -(dVar14 * 0.046875 * dVar17) * local_19f8 * dVar227 +
                 (-dVar14 * dVar63 * dVar228) / 64.0;
  }
  dVar21 = (1.0 / dVar16) / (dVar89 * dVar87);
  dVar234 = dVar21 * dVar93 * dVar234;
  dVar24 = dVar85 * dVar182 * dVar230;
  dVar28 = dVar176 * dVar31 * dVar179 * 1.2599210498948732;
  dVar13 = local_19d0 *
           (-(dVar232 * 10.243508148685079) * dVar28 +
           dVar232 * 12.054540852439857 * dVar24 +
           -(dVar36 * 11.372208351358355) * dVar234 +
           -(dVar229 * 10.243508148685079) * dVar28 +
           dVar229 * 12.054540852439857 * dVar24 +
           -(dVar33 * 18.195533362173368) * dVar234 +
           -(dVar30 * 6.823325010815013) * dVar234 +
           dVar80 * 3.3333333333333335 * dVar173 * 1.5874010519681996 * dVar41 +
           -(dVar80 * dVar97 * 20.0) * dVar12 +
           dVar172 * 3.3333333333333335 * dVar20 +
           -(dVar172 * dVar173 * 26.666666666666668) * dVar12 +
           -(dVar3 * *in_R9 * 6.666666666666667 * dVar202 * 1.2599210498948732) * dVar82 +
           dVar78 * 1.6666666666666667 * dVar20 +
           -(dVar78 * dVar173 * 6.666666666666667) * dVar12 +
           dVar2 * 1.5874010519681996 * 1.6666666666666667 * dVar41 * dVar53 +
           -(dVar2 * 1.2599210498948732 * 6.666666666666667 * dVar13));
  dVar20 = dVar126 * dVar236;
  dVar24 = dVar126 * dVar233 * dVar204;
  dVar28 = dVar126 * dVar233 * dVar203;
  dVar29 = -(dVar46 * dVar42) + dVar12 * 26.666666666666668;
  dVar12 = -(dVar46 * dVar42) - dVar12 * 26.666666666666668;
  dVar30 = dVar236 * *in_RCX * dVar142;
  dVar142 = dVar233 * *in_RCX * dVar142;
  if (((in_stack_00000008[8] != 0) && ((*(uint *)(*in_RDI + 0x40) & 0x10000) != 0)) &&
     ((*(uint *)(*in_RDI + 0x40) & 4) != 0)) {
    lVar9 = in_RSI * (int)in_RDI[0xf];
    *(double *)(in_stack_00000008[8] + lVar9 * 8) =
         *in_RDX * (dVar13 + dVar13 + local_1a50 + local_1a50 + local_1a08 * dVar226 * 2.0 +
                    dVar199 * dVar235 +
                   dVar111 * (-(dVar122 * 6.0) * dVar119 * dVar12 +
                              dVar146 * 6.0 * dVar124 * dVar29 +
                              -(dVar118 * 2.0) * dVar205 * dVar12 +
                              dVar201 * 2.0 * dVar120 * dVar29 +
                              dVar10 * dVar204 * 2.0 * dVar120 * dVar236 +
                              dVar117 * dVar39 * 6.0 * dVar28 +
                              dVar125 * dVar54 * 42.0 * dVar28 +
                              -(dVar35 * 36.0) * dVar24 +
                              -(dVar35 * 36.0) * dVar20 * dVar203 +
                              -(dVar25 * 4.0) * dVar24 +
                              -(dVar25 * 4.0) * dVar20 * dVar203 +
                              dVar122 * 42.0 * dVar54 * dVar233 * dVar203 +
                              dVar104 * dVar124 * 30.0 * dVar20 * dVar204 +
                              dVar206 * 6.0 * dVar127 * dVar29 +
                             dVar59 * 1.7777777777777777 * dVar142 +
                             -(dVar58 * 1.7777777777777777) * dVar30 +
                             dVar47 * 5.333333333333333 * dVar142 +
                             -(dVar18 * 5.333333333333333) * dVar30 +
                             -(dVar146 * 36.0 * dVar119 * dVar233) * dVar204 +
                             -(dVar146 * 36.0 * dVar119 * dVar236) * dVar203 +
                             dVar103 * 30.0 * dVar124 * dVar236 * dVar204 +
                             dVar118 * 6.0 * dVar39 * dVar233 * dVar203 +
                             -(dVar201 * 4.0 * dVar205 * dVar233) * dVar204 +
                             -(dVar201 * 4.0) * dVar205 * dVar236 * dVar203 +
                             -(dVar117 * 2.0) * dVar211 * dVar12 +
                             dVar116 * 2.0 * dVar128 * dVar29 +
                             dVar125 * -6.0 * dVar207 * dVar12 +
                             dVar6 * dVar204 * 2.0 * dVar128 * dVar236)) +
         local_1a18 * 2.0 + dVar231 + dVar237 + *(double *)(in_stack_00000008[8] + lVar9 * 8);
  }
  if ((dVar11 != 0.0) || (NAN(dVar11))) {
    local_1a58 = 0.0;
  }
  else {
    local_1a58 = dVar14 * -0.046875 * dVar17 *
                 local_19a0 *
                 (dVar32 * 1.2599210498948732 * -5.9001347283006016e-05 * dVar214 * dVar145 +
                 dVar38 * 4.5320312222856496e-07 * (1.0 / dVar88) * dVar44);
  }
  dVar43 = dVar43 * dVar214;
  if ((in_stack_00000008[9] != 0) && ((*(uint *)(*in_RDI + 0x40) & 4) != 0)) {
    lVar9 = in_RSI * *(int *)((long)in_RDI + 0x7c);
    *(double *)(in_stack_00000008[9] + lVar9 * 8) =
         *in_RDX * (local_1a58 * 2.0 +
                    local_19d0 * 2.0 *
                    (dVar98 * 3.1537024418869786 * dVar85 * dVar31 * dVar27 +
                    -(dVar98 * 5.761973333635357 * dVar218 * dVar182) * dVar185 +
                    dVar98 * 5.11749375811126 * dVar84 * dVar90 * dVar93 +
                    dVar86 * 3.1537024418869786 * dVar31 * dVar26 * 1.2599210498948732 +
                    -(dVar219 * 5.761973333635357) * dVar220 +
                    dVar4 * dVar84 * 5.11749375811126 * dVar94 +
                    dVar68 * 1.2599210498948732 * -0.8803702389582345 * dVar214 * dVar171 +
                    dVar75 * 0.8260342009151324 * (1.0 / dVar88) * dVar37) +
                   dVar111 * (dVar208 * -0.4444444444444444 * dVar43 +
                             -(dVar212 * 0.4444444444444444 * dVar43))) +
         *(double *)(in_stack_00000008[9] + lVar9 * 8);
  }
  if (((in_stack_00000008[10] != 0) && ((*(uint *)(*in_RDI + 0x40) & 0x8000) != 0)) &&
     ((*(uint *)(*in_RDI + 0x40) & 4) != 0)) {
    lVar9 = in_RSI * (int)in_RDI[0x10];
    *(double *)(in_stack_00000008[10] + lVar9 * 8) =
         *(double *)(in_stack_00000008[10] + lVar9 * 8) + 0.0;
  }
  dVar230 = dVar218 * dVar163 * dVar230;
  dVar13 = dVar85 * dVar21 * dVar179 * 1.2599210498948732;
  dVar12 = dVar209 * dVar236 * dVar42;
  dVar42 = dVar209 * dVar233 * dVar42;
  if (((in_stack_00000008[0xb] != 0) && ((*(uint *)(*in_RDI + 0x40) & 0x10000) != 0)) &&
     ((*(uint *)(*in_RDI + 0x40) & 4) != 0)) {
    lVar9 = in_RSI * *(int *)((long)in_RDI + 0x84);
    *(double *)(in_stack_00000008[0xb] + lVar9 * 8) =
         *in_RDX * (local_19d0 * 2.0 *
                    (dVar232 * 3.8413155557569048 * dVar13 +
                    -(dVar232 * 4.093995006489008) * dVar230 +
                    dVar229 * -4.093995006489008 * dVar230 + dVar229 * 3.8413155557569048 * dVar13)
                   + dVar111 * (-(dVar23 * 0.6666666666666666) * dVar42 +
                               dVar22 * 0.6666666666666666 * dVar12 +
                               dVar15 * 2.0 * dVar12 + -(dVar19 * 2.0 * dVar42))) +
         *(double *)(in_stack_00000008[0xb] + lVar9 * 8);
  }
  if (((in_stack_00000008[0xc] != 0) && ((*(uint *)(*in_RDI + 0x40) & 0x8000) != 0)) &&
     ((*(uint *)(*in_RDI + 0x40) & 4) != 0)) {
    lVar9 = in_RSI * (int)in_RDI[0x11];
    *(double *)(in_stack_00000008[0xc] + lVar9 * 8) =
         *(double *)(in_stack_00000008[0xc] + lVar9 * 8) + 0.0;
  }
  if ((((in_stack_00000008[0xd] != 0) && ((*(uint *)(*in_RDI + 0x40) & 0x8000) != 0)) &&
      ((*(uint *)(*in_RDI + 0x40) & 0x10000) != 0)) && ((*(uint *)(*in_RDI + 0x40) & 4) != 0)) {
    lVar9 = in_RSI * *(int *)((long)in_RDI + 0x8c);
    *(double *)(in_stack_00000008[0xd] + lVar9 * 8) =
         *(double *)(in_stack_00000008[0xd] + lVar9 * 8) + 0.0;
  }
  dVar82 = dVar115 * dVar82;
  dVar13 = dVar173 * 1.2599210498948732 * dVar115;
  if ((dVar11 != 0.0) || (NAN(dVar11))) {
    local_1a60 = 0.0;
  }
  else {
    local_1a60 = dVar14 * -0.046875 * dVar17 *
                 local_19a0 * (dVar51 * 4.0 * dVar13 + dVar1 * 1.2599210498948732 * 4.0 * dVar82);
  }
  dVar11 = dVar85 * ((1.0 / dVar16) / (dVar89 * dVar114)) * dVar93 * 1.2599210498948732;
  dVar14 = dVar236 * dVar236;
  dVar12 = dVar233 * dVar233;
  dVar16 = dVar126 * 1.2599210498948732 * dVar115;
  if (((in_stack_00000008[0xe] != 0) && ((*(uint *)(*in_RDI + 0x40) & 0x10000) != 0)) &&
     ((*(uint *)(*in_RDI + 0x40) & 4) != 0)) {
    lVar9 = in_RSI * (int)in_RDI[0x12];
    *(double *)(in_stack_00000008[0xe] + lVar9 * 8) =
         *in_RDX * (local_1a60 * 2.0 +
                    local_19d0 * 2.0 *
                    (dVar95 * dVar81 * 6.823325010815013 * dVar11 +
                    dVar50 * dVar52 * 10.917320017304021 * dVar11 +
                    dVar5 * dVar79 * dVar97 * 4.093995006489008 * dVar11 +
                    dVar80 * 12.0 * dVar97 * 1.2599210498948732 * dVar115 +
                    dVar172 * 16.0 * dVar13 +
                    dVar3 * 1.2599210498948732 * 4.0 * dVar82 +
                    dVar2 * 1.2599210498948732 * 4.0 * dVar82 + dVar78 * 4.0 * dVar13) +
                   dVar111 * (-(dVar23 * 16.0) * dVar16 +
                             dVar117 * 6.0 * dVar39 * dVar126 * dVar12 +
                             -(dVar22 * 16.0) * dVar16 +
                             -(dVar25 * 8.0) * dVar20 * dVar233 +
                             dVar6 * dVar14 * 2.0 * dVar128 +
                             -(dVar19 * 48.0) * dVar16 +
                             dVar125 * 42.0 * dVar54 * dVar126 * dVar12 +
                             -(dVar15 * 48.0) * dVar16 +
                             -(dVar35 * 72.0) * dVar20 * dVar233 +
                             dVar104 * 30.0 * dVar127 * dVar14 +
                             -(dVar122 * 48.0 * dVar119 * 1.2599210498948732) * dVar115 +
                             dVar122 * 42.0 * dVar54 * dVar12 +
                             -(dVar146 * 48.0 * dVar124 * 1.2599210498948732) * dVar115 +
                             -(dVar146 * 72.0 * dVar119 * dVar236) * dVar233 +
                             dVar103 * 30.0 * dVar124 * dVar14 +
                             -(dVar118 * 16.0) * dVar205 * 1.2599210498948732 * dVar115 +
                             dVar118 * 6.0 * dVar39 * dVar12 +
                             -(dVar201 * 16.0) * dVar120 * 1.2599210498948732 * dVar115 +
                             dVar10 * dVar14 * 2.0 * dVar120 +
                             -(dVar201 * 8.0 * dVar205 * dVar236 * dVar233))) +
         *(double *)(in_stack_00000008[0xe] + lVar9 * 8);
  }
  return;
}

Assistant:

GPU_DEVICE_FUNCTION static inline void
func_fxc_unpol(const xc_func_type *p, size_t ip, const double *rho, const double *sigma, xc_gga_out_params *out)
{
  double t2, t3, t4, t5, t6, t7, t9, t10;
  double t11, t12, t13, t18, t19, t21, t22, t23;
  double t24, t25, t26, t27, t28, t29, t30, t31;
  double t32, t33, t34, t35, t37, t39, t40, t42;
  double t43, t46, tzk0;

  double t48, t49, t50, t51, t55, t57, t58, t60;
  double t61, t62, t63, t64, t65, t66, t67, tvrho0;
  double t70, t71, t72, tvsigma0;

  double t76, t79, t85, t86, t91, t92, t93, t94;
  double t102, t107, t109, t110, t112, t114, t115, t116;
  double t117, t118, t119, t120, t121, t122, t123, t126;
  double t127, t128, t129, tv2rho20, t133, t134, t135, t136;
  double t139, tv2rhosigma0, t147, t148, t149, t150, t151, t152;
  double t157, t158, t159, t163, t164, t165, tv2sigma20;


  t2 = POW_1_3(p->zeta_threshold);
  t3 = t2 * t2;
  t4 = my_piecewise3(0.1e1 <= p->zeta_threshold, t3, 1);
  t5 = t4 * t4;
  t6 = t5 * t4;
  t7 = M_CBRT3;
  t9 = POW_1_3(0.1e1 / M_PI);
  t10 = t7 * t9;
  t11 = M_CBRT4;
  t12 = t11 * t11;
  t13 = POW_1_3(rho[0]);
  t18 = 0.488827e1 + 0.79425925e0 * t10 * t12 / t13;
  t19 = atan(t18);
  t21 = -0.655868e0 * t19 + 0.897889e0;
  t22 = t6 * t21;
  t23 = t7 * t7;
  t24 = t22 * t23;
  t25 = 0.1e1 / t9;
  t26 = t25 * t11;
  t27 = M_CBRT6;
  t28 = t27 * t27;
  t29 = M_PI * M_PI;
  t30 = POW_1_3(t29);
  t31 = 0.1e1 / t30;
  t32 = t28 * t31;
  t33 = M_CBRT2;
  t34 = sqrt(sigma[0]);
  t35 = t33 * t34;
  t37 = 0.1e1 / t13 / rho[0];
  t39 = t32 * t35 * t37;
  t40 = pow(t39, 0.23e1);
  t42 = 0.1e1 + 0.47121507034422759993e-2 * t40;
  t43 = 0.1e1 / t42;
  t46 = t24 * t26 * t13 * t43;
  tzk0 = t46 / 0.3e1;

  if(out->zk != NULL && (p->info->flags & XC_FLAGS_HAVE_EXC))
    out->zk[ip*p->dim.zk + 0] += tzk0;

  t48 = t18 * t18;
  t49 = t48 + 0.1e1;
  t50 = 0.1e1 / t49;
  t51 = t6 * t50;
  t55 = 0.1e1 / rho[0] * t6;
  t57 = t23 * t25;
  t58 = t57 * t11;
  t60 = t42 * t42;
  t61 = 0.1e1 / t60;
  t62 = pow(t39, 0.13e1);
  t63 = t61 * t62;
  t64 = t63 * t28;
  t65 = t31 * t33;
  t66 = t65 * t34;
  t67 = t64 * t66;
  tvrho0 = 0.4e1 / 0.9e1 * t46 + 0.69457230103866666663e0 * t51 * t43 + 0.48168651635187710217e-2 * t55 * t21 * t58 * t67;

  if(out->vrho != NULL && (p->info->flags & XC_FLAGS_HAVE_VXC))
    out->vrho[ip*p->dim.vrho + 0] += tvrho0;

  t70 = t22 * t58;
  t71 = 0.1e1 / t34;
  t72 = t65 * t71;
  tvsigma0 = -0.18063244363195391331e-2 * t70 * t64 * t72;

  if(out->vsigma != NULL && (p->info->flags & XC_FLAGS_HAVE_VXC))
    out->vsigma[ip*p->dim.vsigma + 0] += tvsigma0;

  t76 = t50 * t43;
  t79 = t13 * t13;
  t85 = rho[0] * rho[0];
  t86 = 0.1e1 / t85;
  t91 = t49 * t49;
  t92 = 0.1e1 / t91;
  t93 = t6 * t92;
  t94 = t43 * t18;
  t102 = 0.1e1 / t13 / t85;
  t107 = t85 * rho[0];
  t109 = 0.1e1 / t13 / t107;
  t110 = t109 * t6;
  t112 = t110 * t21 * t58;
  t114 = 0.1e1 / t60 / t42;
  t115 = pow(t39, 0.26e1);
  t116 = t114 * t115;
  t117 = t116 * t27;
  t118 = t30 * t30;
  t119 = 0.1e1 / t118;
  t120 = t33 * t33;
  t121 = t119 * t120;
  t122 = t121 * sigma[0];
  t123 = t117 * t122;
  t126 = pow(t39, 0.3e0);
  t127 = t61 * t126;
  t128 = t127 * t27;
  t129 = t128 * t122;
  tv2rho20 = 0.92609640138488888884e0 * t55 * t76 + 0.4e1 / 0.27e2 * t24 * t26 / t79 * t43 + 0.16056217211729236738e-2 * t24 * t26 * t86 * t67 + 0.36778031659583040509e0 * t93 * t94 * t10 * t12 * t37 + 0.20073966722509356988e-1 * t51 * t63 * t32 * t35 * t102 + 0.83527884012674580095e-3 * t112 * t123 - 0.50095397700595218626e-1 * t112 * t129;

  if(out->v2rho2 != NULL && (p->info->flags & XC_FLAGS_HAVE_FXC))
    out->v2rho2[ip*p->dim.v2rho2 + 0] += tv2rho20;

  t133 = t50 * t61;
  t134 = t6 * t37 * t133;
  t135 = t62 * t28;
  t136 = t135 * t72;
  t139 = t121 * t102;
  tv2rhosigma0 = -0.37638687604705044352e-2 * t134 * t136 - 0.31322956504752967535e-3 * t70 * t117 * t139 + 0.18785774137723206984e-1 * t70 * t128 * t139;

  if(out->v2rhosigma != NULL && (p->info->flags & XC_FLAGS_HAVE_FXC))
    out->v2rhosigma[ip*p->dim.v2rhosigma + 0] += tv2rhosigma0;

  t147 = t24 * t26 * t114;
  t148 = t115 * t27;
  t149 = t148 * t119;
  t150 = 0.1e1 / sigma[0];
  t151 = t120 * t150;
  t152 = t151 * t37;
  t157 = t24 * t26 * t61;
  t158 = t126 * t27;
  t159 = t158 * t119;
  t163 = t34 * sigma[0];
  t164 = 0.1e1 / t163;
  t165 = t65 * t164;
  tv2sigma20 = 0.11746108689282362825e-3 * t147 * t149 * t152 - 0.70446653016462026191e-2 * t157 * t159 * t152 + 0.90316221815976956655e-3 * t70 * t64 * t165;

  if(out->v2sigma2 != NULL && (p->info->flags & XC_FLAGS_HAVE_FXC))
    out->v2sigma2[ip*p->dim.v2sigma2 + 0] += tv2sigma20;

}